

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.h
# Opt level: O1

void TTD::NSSnapObjects::AssertSnapEquiv_SnapArrayInfoCore<double>
               (SnapArrayInfoBlock<double> *arrayInfo1,SnapArrayInfoBlock<double> *arrayInfo2,
               TTDCompareMap *compareMap)

{
  SnapArrayInfoBlock<double> **segment;
  SnapArrayInfoBlock<double> **pos;
  SnapArrayInfoBlock<double> **index;
  SnapArrayInfoBlock<double> *local_50;
  SnapArrayInfoBlock<double> *arrayInfo2_local;
  uint32 index1;
  uint32 index2;
  SnapArrayInfoBlock<double> *arrayInfo1_local;
  uint32 pos1;
  uint32 pos2;
  
  arrayInfo2_local._4_4_ = 0;
  arrayInfo2_local._0_4_ = 0;
  if (arrayInfo1 != (SnapArrayInfoBlock<double> *)0x0) {
    arrayInfo2_local._0_4_ = arrayInfo1->FirstIndex;
  }
  arrayInfo1_local._0_4_ = 0;
  if (arrayInfo2 != (SnapArrayInfoBlock<double> *)0x0) {
    arrayInfo2_local._4_4_ = arrayInfo2->FirstIndex;
  }
  arrayInfo1_local._4_4_ = 0;
  local_50 = arrayInfo2;
  _index1 = arrayInfo1;
  if (arrayInfo2 != (SnapArrayInfoBlock<double> *)0x0 &&
      arrayInfo1 != (SnapArrayInfoBlock<double> *)0x0) {
    do {
      if ((uint32)arrayInfo2_local < arrayInfo2_local._4_4_) {
        TTDCompareMap::DiagnosticAssert
                  (compareMap,_index1->ArrayValidTags[(uint)arrayInfo1_local] == '\0');
        segment = (SnapArrayInfoBlock<double> **)&index1;
        pos = &arrayInfo1_local;
        index = &arrayInfo2_local;
      }
      else {
        if (arrayInfo2_local._4_4_ < (uint32)arrayInfo2_local) {
          TTDCompareMap::DiagnosticAssert
                    (compareMap,local_50->ArrayValidTags[arrayInfo1_local._4_4_] == '\0');
        }
        else {
          TTDCompareMap::DiagnosticAssert
                    (compareMap,
                     _index1->ArrayValidTags[(uint)arrayInfo1_local] ==
                     local_50->ArrayValidTags[arrayInfo1_local._4_4_]);
          if (_index1->ArrayValidTags[(uint)arrayInfo1_local] != '\0') {
            SnapArrayInfo_EquivValue
                      (_index1->ArrayRangeContents[(uint)arrayInfo1_local],
                       local_50->ArrayRangeContents[arrayInfo1_local._4_4_],compareMap,
                       (uint32)arrayInfo2_local);
          }
          AdvanceArrayIndex_SnapArrayInfoCompare<double>
                    ((uint32 *)&arrayInfo2_local,(uint32 *)&arrayInfo1_local,
                     (SnapArrayInfoBlock<double> **)&index1);
        }
        index = (SnapArrayInfoBlock<double> **)((long)&arrayInfo2_local + 4);
        pos = (SnapArrayInfoBlock<double> **)((long)&arrayInfo1_local + 4);
        segment = &local_50;
      }
      AdvanceArrayIndex_SnapArrayInfoCompare<double>((uint32 *)index,(uint32 *)pos,segment);
    } while ((_index1 != (SnapArrayInfoBlock<double> *)0x0) &&
            (local_50 != (SnapArrayInfoBlock<double> *)0x0));
  }
  if (_index1 != (SnapArrayInfoBlock<double> *)0x0) {
    do {
      TTDCompareMap::DiagnosticAssert
                (compareMap,_index1->ArrayValidTags[(uint)arrayInfo1_local] == '\0');
      AdvanceArrayIndex_SnapArrayInfoCompare<double>
                ((uint32 *)&arrayInfo2_local,(uint32 *)&arrayInfo1_local,
                 (SnapArrayInfoBlock<double> **)&index1);
    } while (_index1 != (SnapArrayInfoBlock<double> *)0x0);
  }
  if (_index1 != (SnapArrayInfoBlock<double> *)0x0) {
    do {
      TTDCompareMap::DiagnosticAssert
                (compareMap,local_50->ArrayValidTags[arrayInfo1_local._4_4_] == '\0');
      AdvanceArrayIndex_SnapArrayInfoCompare<double>
                ((uint32 *)((long)&arrayInfo2_local + 4),(uint32 *)((long)&arrayInfo1_local + 4),
                 &local_50);
    } while (_index1 != (SnapArrayInfoBlock<double> *)0x0);
  }
  return;
}

Assistant:

void AssertSnapEquiv_SnapArrayInfoCore(const SnapArrayInfoBlock<T>* arrayInfo1, const SnapArrayInfoBlock<T>* arrayInfo2, TTDCompareMap& compareMap)
        {
            uint32 index1 = (arrayInfo1 != nullptr) ? arrayInfo1->FirstIndex : 0;
            uint32 pos1 = 0;

            uint32 index2 = (arrayInfo2 != nullptr) ? arrayInfo2->FirstIndex : 0;
            uint32 pos2 = 0;

            while(arrayInfo1 != nullptr && arrayInfo2 != nullptr)
            {
                if(index1 < index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                }
                else if(index1 > index2)
                {
                    compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
                else
                {
                    compareMap.DiagnosticAssert(arrayInfo1->ArrayValidTags[pos1] == arrayInfo2->ArrayValidTags[pos2]);
                    if(arrayInfo1->ArrayValidTags[pos1])
                    {
                        SnapArrayInfo_EquivValue(arrayInfo1->ArrayRangeContents[pos1], arrayInfo2->ArrayRangeContents[pos2], compareMap, index1);
                    }

                    AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
                    AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
                }
            }

            //make sure any remaining entries an empty
            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo1->ArrayValidTags[pos1]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index1, &pos1, &arrayInfo1);
            }

            while(arrayInfo1 != nullptr)
            {
                compareMap.DiagnosticAssert(!arrayInfo2->ArrayValidTags[pos2]);
                AdvanceArrayIndex_SnapArrayInfoCompare(&index2, &pos2, &arrayInfo2);
            }
        }